

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O0

uint hex_val(char ch)

{
  char ch_local;
  undefined4 local_4;
  
  if ((ch < '0') || ('9' < ch)) {
    if ((ch < 'A') || ('Z' < ch)) {
      local_4 = (int)ch - 0x57;
    }
    else {
      local_4 = (int)ch - 0x37;
    }
  }
  else {
    local_4 = (int)ch - 0x30;
  }
  return local_4;
}

Assistant:

static unsigned
hex_val(char ch)
{
    if('0' <= ch && ch <= '9')
        return ch - '0';
    if('A' <= ch && ch <= 'Z')
        return ch - 'A' + 10;
    else
        return ch - 'a' + 10;
}